

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O1

void Abc_GenOneHot(char *pFileName,int nVars)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  
  uVar6 = (ulong)(uint)nVars;
  __stream = fopen(pFileName,"w");
  pcVar3 = Extra_TimeStamp();
  fprintf(__stream,"# One-hotness condition for %d vars generated by ABC on %s\n",uVar6,pcVar3);
  fprintf(__stream,".model 1hot_%dvars\n",(ulong)(uint)nVars);
  fwrite(".inputs",7,1,__stream);
  if (1 < (uint)nVars) {
    uVar6 = 0;
    if (nVars - 1U != 0) {
      uVar6 = 0;
      uVar8 = nVars - 1U;
      do {
        uVar6 = (ulong)((int)uVar6 + 1);
        bVar1 = 9 < uVar8;
        uVar8 = uVar8 / 10;
      } while (bVar1);
    }
  }
  if (0 < nVars) {
    uVar9 = 0;
    do {
      fprintf(__stream," i%0*d",uVar6,uVar9);
      uVar8 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar8;
    } while (nVars != uVar8);
  }
  fputc(10,__stream);
  fwrite(".outputs",8,1,__stream);
  iVar2 = (nVars + -1) * nVars;
  uVar8 = iVar2 / 2;
  uVar9 = (ulong)uVar8;
  if (1 < uVar8) {
    uVar9 = 0;
    uVar4 = uVar8 - 1;
    if (uVar4 != 0) {
      do {
        uVar9 = (ulong)((int)uVar9 + 1);
        bVar1 = 9 < uVar4;
        uVar4 = uVar4 / 10;
      } while (bVar1);
    }
  }
  if (1 < iVar2) {
    uVar7 = 0;
    do {
      fprintf(__stream," o%0*d",uVar9,uVar7);
      uVar4 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar4;
    } while (uVar8 != uVar4);
  }
  fputc(10,__stream);
  if (0 < nVars) {
    uVar8 = 0;
    uVar7 = 0;
    do {
      uVar5 = (ulong)uVar8;
      uVar8 = uVar8 + 1;
      uVar4 = uVar8;
      if ((int)uVar8 < nVars) {
        do {
          fprintf(__stream,".names i%0*d i%0*d o%0*d\n",uVar6,uVar5,uVar6,(ulong)uVar4,uVar9,uVar7);
          fwrite("11 0\n",5,1,__stream);
          uVar7 = (ulong)((int)uVar7 + 1);
          uVar4 = uVar4 + 1;
        } while (nVars != uVar4);
      }
    } while (uVar8 != nVars);
  }
  fwrite(".end\n",5,1,__stream);
  fputc(10,__stream);
  fclose(__stream);
  return;
}

Assistant:

void Abc_GenOneHot( char * pFileName, int nVars )
{
    FILE * pFile;
    int i, k, Counter, nDigitsIn, nDigitsOut;
    pFile = fopen( pFileName, "w" );
    fprintf( pFile, "# One-hotness condition for %d vars generated by ABC on %s\n", nVars, Extra_TimeStamp() );
    fprintf( pFile, ".model 1hot_%dvars\n", nVars );
    fprintf( pFile, ".inputs" );
    nDigitsIn = Abc_Base10Log( nVars );
    for ( i = 0; i < nVars; i++ )
        fprintf( pFile, " i%0*d", nDigitsIn, i );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".outputs" );
    nDigitsOut = Abc_Base10Log( nVars * (nVars - 1) / 2 );
    for ( i = 0; i < nVars * (nVars - 1) / 2; i++ )
        fprintf( pFile, " o%0*d", nDigitsOut, i );
    fprintf( pFile, "\n" );
    Counter = 0;
    for ( i = 0; i < nVars; i++ )
        for ( k = i+1; k < nVars; k++ )
        {
            fprintf( pFile, ".names i%0*d i%0*d o%0*d\n", nDigitsIn, i, nDigitsIn, k, nDigitsOut, Counter ); 
            fprintf( pFile, "11 0\n" ); 
            Counter++;
        }
    fprintf( pFile, ".end\n" ); 
    fprintf( pFile, "\n" ); 
    fclose( pFile );
}